

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O2

void __thiscall
VW::object_pool<obj,_obj_initializer>::new_chunk
          (object_pool<obj,_obj_initializer> *this,size_t size)

{
  pointer puVar1;
  long lVar2;
  bool bVar3;
  pair<obj_*,_obj_*> local_38;
  
  if (size != 0) {
    local_38.first = (obj *)operator_new__(-(ulong)(size >> 0x3e != 0) | size * 4);
    std::
    vector<std::unique_ptr<obj[],std::default_delete<obj[]>>,std::allocator<std::unique_ptr<obj[],std::default_delete<obj[]>>>>
    ::emplace_back<std::unique_ptr<obj[],std::default_delete<obj[]>>>
              ((vector<std::unique_ptr<obj[],std::default_delete<obj[]>>,std::allocator<std::unique_ptr<obj[],std::default_delete<obj[]>>>>
                *)&this->m_chunks,(unique_ptr<obj[],_std::default_delete<obj[]>_> *)&local_38);
    std::unique_ptr<obj[],_std::default_delete<obj[]>_>::~unique_ptr
              ((unique_ptr<obj[],_std::default_delete<obj[]>_> *)&local_38);
    puVar1 = (this->m_chunks).
             super__Vector_base<std::unique_ptr<obj[],_std::default_delete<obj[]>_>,_std::allocator<std::unique_ptr<obj[],_std::default_delete<obj[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38.first =
         puVar1[-1]._M_t.super___uniq_ptr_impl<obj,_std::default_delete<obj[]>_>._M_t.
         super__Tuple_impl<0UL,_obj_*,_std::default_delete<obj[]>_>.
         super__Head_base<0UL,_obj_*,_false>._M_head_impl;
    local_38.second = local_38.first + (size - 1);
    std::vector<std::pair<obj*,obj*>,std::allocator<std::pair<obj*,obj*>>>::
    emplace_back<std::pair<obj*,obj*>>
              ((vector<std::pair<obj*,obj*>,std::allocator<std::pair<obj*,obj*>>> *)
               &this->m_chunk_bounds,&local_38);
    lVar2 = 0;
    while (bVar3 = size != 0, size = size - 1, bVar3) {
      *(undefined4 *)
       ((long)&(puVar1[-1]._M_t.super___uniq_ptr_impl<obj,_std::default_delete<obj[]>_>._M_t.
                super__Tuple_impl<0UL,_obj_*,_std::default_delete<obj[]>_>.
                super__Head_base<0UL,_obj_*,_false>._M_head_impl)->i + lVar2) = 0;
      *(undefined4 *)
       ((long)&(puVar1[-1]._M_t.super___uniq_ptr_impl<obj,_std::default_delete<obj[]>_>._M_t.
                super__Tuple_impl<0UL,_obj_*,_std::default_delete<obj[]>_>.
                super__Head_base<0UL,_obj_*,_false>._M_head_impl)->i + lVar2) = 0;
      local_38.first =
           (obj *)((long)&(puVar1[-1]._M_t.super___uniq_ptr_impl<obj,_std::default_delete<obj[]>_>.
                           _M_t.super__Tuple_impl<0UL,_obj_*,_std::default_delete<obj[]>_>.
                           super__Head_base<0UL,_obj_*,_false>._M_head_impl)->i + lVar2);
      std::deque<obj*,std::allocator<obj*>>::emplace_back<obj*>
                ((deque<obj*,std::allocator<obj*>> *)&this->m_pool,&local_38.first);
      lVar2 = lVar2 + 4;
    }
  }
  return;
}

Assistant:

void new_chunk(size_t size)
  {
    if(size == 0)
    {
      return;
    }

    m_chunks.push_back(std::unique_ptr<T[]>(new T[size]));
    auto& chunk = m_chunks.back();
    m_chunk_bounds.push_back({&chunk[0], &chunk[size - 1]});

    for (size_t i = 0; i < size; i++)
    {
      memset(&chunk[i], 0, sizeof(T));
      new (&chunk[i]) T{};
      m_pool.push(m_initializer(&chunk[i]));
    }
  }